

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_contains_range(roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  uint8_t typecode;
  int iVar1;
  container_t *c;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint range_start_00;
  uint32_t range_end_00;
  ulong uVar7;
  long lVar8;
  int iVar9;
  
  uVar7 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar7 = range_end;
  }
  if (uVar7 <= range_start) {
    return true;
  }
  if (uVar7 - range_start == 1) {
    _Var2 = roaring_bitmap_contains(r,(uint)range_start);
    return _Var2;
  }
  lVar8 = uVar7 - 1;
  iVar6 = (int)((ulong)lVar8 >> 0x10);
  iVar9 = (int)(range_start >> 0x10);
  iVar5 = iVar6 - iVar9;
  iVar1 = (r->high_low_container).size;
  if (iVar5 < iVar1) {
    uVar3 = ra_get_index(&r->high_low_container,(uint16_t)(range_start >> 0x10));
    uVar4 = ra_get_index(&r->high_low_container,(uint16_t)((ulong)lVar8 >> 0x10));
    if (iVar1 <= (int)uVar4) {
      return false;
    }
    if ((int)uVar4 < 0) {
      return false;
    }
    if ((int)uVar3 < 0) {
      return false;
    }
    if (uVar4 - uVar3 != iVar5) {
      return false;
    }
    range_start_00 = (uint)range_start & 0xffff;
    range_end_00 = ((uint)lVar8 & 0xffff) + 1;
    typecode = (r->high_low_container).typecodes[uVar3 & 0xffff];
    c = (r->high_low_container).containers[uVar3 & 0xffff];
    if (iVar6 == iVar9) {
      _Var2 = container_contains_range(c,range_start_00,range_end_00,typecode);
      return _Var2;
    }
    _Var2 = container_contains_range(c,range_start_00,0x10000,typecode);
    if (_Var2) {
      _Var2 = container_contains_range
                        ((r->high_low_container).containers[uVar4 & 0xffff],0,range_end_00,
                         (r->high_low_container).typecodes[uVar4 & 0xffff]);
      if (!_Var2) {
        return false;
      }
      do {
        uVar3 = uVar3 + 1;
        if ((int)uVar4 <= (int)uVar3) {
          return (int)uVar4 <= (int)uVar3;
        }
        _Var2 = container_is_full((r->high_low_container).containers[uVar3 & 0xffff],
                                  (r->high_low_container).typecodes[uVar3 & 0xffff]);
      } while (_Var2);
      return (int)uVar4 <= (int)uVar3;
    }
  }
  return false;
}

Assistant:

bool roaring_bitmap_contains_range(const roaring_bitmap_t *r,
                                   uint64_t range_start, uint64_t range_end) {
    if (range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }
    if (range_start >= range_end)
        return true;  // empty range are always contained!
    if (range_end - range_start == 1)
        return roaring_bitmap_contains(r, (uint32_t)range_start);
    uint16_t hb_rs = (uint16_t)(range_start >> 16);
    uint16_t hb_re = (uint16_t)((range_end - 1) >> 16);
    const int32_t span = hb_re - hb_rs;
    const int32_t hlc_sz = ra_get_size(&r->high_low_container);
    if (hlc_sz < span + 1) {
        return false;
    }
    int32_t is = ra_get_index(&r->high_low_container, hb_rs);
    int32_t ie = ra_get_index(&r->high_low_container, hb_re);
    if ((ie < 0) || (is < 0) || ((ie - is) != span) || ie >= hlc_sz) {
        return false;
    }
    const uint32_t lb_rs = range_start & 0xFFFF;
    const uint32_t lb_re = ((range_end - 1) & 0xFFFF) + 1;
    uint8_t type;
    container_t *c =
        ra_get_container_at_index(&r->high_low_container, (uint16_t)is, &type);
    if (hb_rs == hb_re) {
        return container_contains_range(c, lb_rs, lb_re, type);
    }
    if (!container_contains_range(c, lb_rs, 1 << 16, type)) {
        return false;
    }
    c = ra_get_container_at_index(&r->high_low_container, (uint16_t)ie, &type);
    if (!container_contains_range(c, 0, lb_re, type)) {
        return false;
    }
    for (int32_t i = is + 1; i < ie; ++i) {
        c = ra_get_container_at_index(&r->high_low_container, (uint16_t)i,
                                      &type);
        if (!container_is_full(c, type)) {
            return false;
        }
    }
    return true;
}